

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *p_j2k,opj_image_t *p_image)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  OPJ_UINT32 src_compno;
  opj_image_comp_t *newcomps;
  OPJ_UINT32 compno;
  opj_image_t *p_image_local;
  opj_j2k_t *p_j2k_local;
  
  if ((p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode == 0) {
    for (newcomps._4_4_ = 0; newcomps._4_4_ < p_image->numcomps; newcomps._4_4_ = newcomps._4_4_ + 1
        ) {
      p_image->comps[newcomps._4_4_].resno_decoded =
           p_j2k->m_output_image->comps[newcomps._4_4_].resno_decoded;
      opj_image_data_free(p_image->comps[newcomps._4_4_].data);
      p_image->comps[newcomps._4_4_].data = p_j2k->m_output_image->comps[newcomps._4_4_].data;
      p_j2k->m_output_image->comps[newcomps._4_4_].data = (OPJ_INT32 *)0x0;
    }
  }
  else {
    poVar2 = (opj_image_comp_t *)
             opj_malloc((ulong)(p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode << 6);
    if (poVar2 == (opj_image_comp_t *)0x0) {
      opj_image_destroy(p_j2k->m_private_image);
      p_j2k->m_private_image = (opj_image_t *)0x0;
      return 0;
    }
    for (newcomps._4_4_ = 0; newcomps._4_4_ < p_image->numcomps; newcomps._4_4_ = newcomps._4_4_ + 1
        ) {
      opj_image_data_free(p_image->comps[newcomps._4_4_].data);
      p_image->comps[newcomps._4_4_].data = (OPJ_INT32 *)0x0;
    }
    for (newcomps._4_4_ = 0;
        newcomps._4_4_ < (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
        newcomps._4_4_ = newcomps._4_4_ + 1) {
      uVar1 = (p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[newcomps._4_4_];
      memcpy(poVar2 + newcomps._4_4_,p_j2k->m_output_image->comps + uVar1,0x40);
      poVar2[newcomps._4_4_].resno_decoded = p_j2k->m_output_image->comps[uVar1].resno_decoded;
      poVar2[newcomps._4_4_].data = p_j2k->m_output_image->comps[uVar1].data;
      p_j2k->m_output_image->comps[uVar1].data = (OPJ_INT32 *)0x0;
    }
    for (newcomps._4_4_ = 0; newcomps._4_4_ < p_image->numcomps; newcomps._4_4_ = newcomps._4_4_ + 1
        ) {
      if (p_j2k->m_output_image->comps[newcomps._4_4_].data != (OPJ_INT32 *)0x0) {
        __assert_fail("p_j2k->m_output_image->comps[compno].data == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2eb9,
                      "OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t *, opj_image_t *)"
                     );
      }
      opj_image_data_free(p_j2k->m_output_image->comps[newcomps._4_4_].data);
      p_j2k->m_output_image->comps[newcomps._4_4_].data = (OPJ_INT32 *)0x0;
    }
    p_image->numcomps = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
    opj_free(p_image->comps);
    p_image->comps = poVar2;
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_move_data_from_codec_to_output_image(opj_j2k_t * p_j2k,
        opj_image_t * p_image)
{
    OPJ_UINT32 compno;

    /* Move data and copy one information from codec to output image*/
    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode > 0) {
        opj_image_comp_t* newcomps =
            (opj_image_comp_t*) opj_malloc(
                p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode *
                sizeof(opj_image_comp_t));
        if (newcomps == NULL) {
            opj_image_destroy(p_j2k->m_private_image);
            p_j2k->m_private_image = NULL;
            return OPJ_FALSE;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = NULL;
        }
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 src_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            memcpy(&(newcomps[compno]),
                   &(p_j2k->m_output_image->comps[src_compno]),
                   sizeof(opj_image_comp_t));
            newcomps[compno].resno_decoded =
                p_j2k->m_output_image->comps[src_compno].resno_decoded;
            newcomps[compno].data = p_j2k->m_output_image->comps[src_compno].data;
            p_j2k->m_output_image->comps[src_compno].data = NULL;
        }
        for (compno = 0; compno < p_image->numcomps; compno++) {
            assert(p_j2k->m_output_image->comps[compno].data == NULL);
            opj_image_data_free(p_j2k->m_output_image->comps[compno].data);
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
        p_image->numcomps = p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode;
        opj_free(p_image->comps);
        p_image->comps = newcomps;
    } else {
        for (compno = 0; compno < p_image->numcomps; compno++) {
            p_image->comps[compno].resno_decoded =
                p_j2k->m_output_image->comps[compno].resno_decoded;
            opj_image_data_free(p_image->comps[compno].data);
            p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
#if 0
            char fn[256];
            sprintf(fn, "/tmp/%d.raw", compno);
            FILE *debug = fopen(fn, "wb");
            fwrite(p_image->comps[compno].data, sizeof(OPJ_INT32),
                   p_image->comps[compno].w * p_image->comps[compno].h, debug);
            fclose(debug);
#endif
            p_j2k->m_output_image->comps[compno].data = NULL;
        }
    }
    return OPJ_TRUE;
}